

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_core_ll.c
# Opt level: O1

IOTHUB_CLIENT_RESULT
IoTHubClientCore_LL_GetRetryPolicy
          (IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle,IOTHUB_CLIENT_RETRY_POLICY *retryPolicy,
          size_t *retryTimeoutLimitInSeconds)

{
  LOGGER_LOG p_Var1;
  IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *handleData;
  IOTHUB_CLIENT_RESULT IVar2;
  
  if ((retryPolicy == (IOTHUB_CLIENT_RETRY_POLICY *)0x0 ||
      iotHubClientHandle == (IOTHUB_CLIENT_CORE_LL_HANDLE)0x0) ||
      retryTimeoutLimitInSeconds == (size_t *)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 == (LOGGER_LOG)0x0) {
      IVar2 = IOTHUB_CLIENT_INVALID_ARG;
    }
    else {
      IVar2 = IOTHUB_CLIENT_INVALID_ARG;
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                ,"IoTHubClientCore_LL_GetRetryPolicy",0x8c2,1,
                "Invalid parameter IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle = %p, IOTHUB_CLIENT_RETRY_POLICY* retryPolicy = %p, size_t* retryTimeoutLimitInSeconds = %p"
                ,iotHubClientHandle,retryPolicy,retryTimeoutLimitInSeconds);
    }
  }
  else {
    *retryPolicy = iotHubClientHandle->retryPolicy;
    *retryTimeoutLimitInSeconds = iotHubClientHandle->retryTimeoutLimitInSeconds;
    IVar2 = IOTHUB_CLIENT_OK;
  }
  return IVar2;
}

Assistant:

IOTHUB_CLIENT_RESULT IoTHubClientCore_LL_GetRetryPolicy(IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle, IOTHUB_CLIENT_RETRY_POLICY* retryPolicy, size_t* retryTimeoutLimitInSeconds)
{
    IOTHUB_CLIENT_RESULT result;

    if (iotHubClientHandle == NULL || retryPolicy == NULL || retryTimeoutLimitInSeconds == NULL)
    {
        LogError("Invalid parameter IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle = %p, IOTHUB_CLIENT_RETRY_POLICY* retryPolicy = %p, size_t* retryTimeoutLimitInSeconds = %p", iotHubClientHandle, retryPolicy, retryTimeoutLimitInSeconds);
        result = IOTHUB_CLIENT_INVALID_ARG;
    }
    else
    {
        IOTHUB_CLIENT_CORE_LL_HANDLE_DATA* handleData = (IOTHUB_CLIENT_CORE_LL_HANDLE_DATA*)iotHubClientHandle;

        *retryPolicy = handleData->retryPolicy;
        *retryTimeoutLimitInSeconds = handleData->retryTimeoutLimitInSeconds;
        result = IOTHUB_CLIENT_OK;
    }

    return result;
}